

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDVertex::HasBoundaryVertexTopology(ON_SubDVertex *this)

{
  ushort uVar1;
  short sVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = this->m_edge_count;
  if ((((1 < uVar1) && (this->m_face_count + 1 == (uint)uVar1)) &&
      (this->m_edges != (ON_SubDEdgePtr *)0x0)) && (this->m_faces != (ON_SubDFace **)0x0)) {
    iVar4 = 0;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      uVar5 = this->m_edges[uVar3].m_ptr & 0xfffffffffffffff8;
      if (uVar5 == 0) {
        return false;
      }
      sVar2 = (short)*(undefined4 *)(uVar5 + 100);
      if ((ushort)(sVar2 - 3U) < 0xfffe) {
        return false;
      }
      iVar4 = iVar4 + (uint)(sVar2 == 1);
    }
    if (iVar4 == 2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_SubDVertex::HasBoundaryVertexTopology() const
{
  if (m_edge_count >= 2 && m_edge_count == m_face_count+1 && nullptr != m_edges && nullptr != m_faces)
  {
    unsigned boundary_count = 0;
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 0 == e->m_face_count || e->m_face_count > 2)
        return false;
      if (1 == e->m_face_count)
        ++boundary_count;
    }
    if (2 == boundary_count)
      return true;
  }    
  return false;
}